

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

int Internal_compare_ngon_edges(void *a,void *b)

{
  uint *bi;
  uint *ai;
  void *b_local;
  void *a_local;
  
  if (*a < *b) {
    a_local._4_4_ = -1;
  }
  else if (*b < *a) {
    a_local._4_4_ = 1;
  }
  else if (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) {
    a_local._4_4_ = -1;
  }
  else if (*(uint *)((long)b + 4) < *(uint *)((long)a + 4)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int Internal_compare_ngon_edges(const void* a, const void* b)
{
  const unsigned int* ai = (const unsigned int*)a;
  const unsigned int* bi = (const unsigned int*)b;
  if (*ai < *bi)
    return -1;
  if (*ai > *bi)
    return 1;
  ai++;
  bi++;
  if (*ai < *bi)
    return -1;
  if (*ai > *bi)
    return 1;
  return 0;
}